

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3img.cpp
# Opt level: O0

void CTcGenTarg::multimethod_init_cb(void *ctx0,CTcSymbol *sym)

{
  char *pcVar1;
  bool bVar2;
  CTcCodeStream *this;
  tc_symtype_t tVar3;
  int iVar4;
  tc_metaclass_t meta;
  tctarg_obj_id_t tVar5;
  int iVar6;
  char *pcVar7;
  CTcSymbol *this_00;
  CTcSymObjBase *this_01;
  ulong obj;
  char *__n;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  CVmHashEntry *in_RSI;
  long *in_RDI;
  CTPNConst cval_1;
  CTcSymMetaclass *cm;
  CTcSymObj *co;
  CTcConstVal val_1;
  CTcSymbol *cl;
  CTPNConst cval;
  CTcConstVal val;
  size_t plen;
  CTcSymFunc *base_sym;
  size_t funclen;
  char *funcname;
  int argc;
  int is_mm;
  size_t rem;
  char *p;
  CTcSymFunc *fsym;
  mminit_ctx *ctx;
  CTcConstVal *in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  CTcDataStream *in_stack_fffffffffffffeb8;
  CTcGenTarg *in_stack_fffffffffffffec0;
  undefined7 in_stack_fffffffffffffed8;
  undefined1 uVar8;
  CTcGenTarg *in_stack_fffffffffffffee0;
  CTcSymObjBase *in_stack_ffffffffffffff18;
  CTPNConst *in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff9f;
  CTcGenTarg *in_stack_ffffffffffffffa0;
  ulong local_58;
  int local_38;
  size_t local_30;
  char *local_28;
  
  tVar3 = CTcSymbolBase::get_type((CTcSymbolBase *)in_RSI);
  if (tVar3 == TC_SYM_FUNC) {
    local_28 = CVmHashEntry::getstr(in_RSI);
    local_30 = CVmHashEntry::getlen(in_RSI);
    bVar2 = false;
    for (; local_30 != 0; local_30 = local_30 - 1) {
      if (*local_28 == '*') {
        bVar2 = true;
        break;
      }
      iVar6 = is_sym(L'\0');
      if (iVar6 == 0) break;
      local_28 = local_28 + 1;
    }
    if (bVar2) {
      pcVar7 = CVmHashEntry::getstr(in_RSI);
      iVar6 = (int)local_28;
      __n = pcVar7;
      CTcParser::get_global_symtab(G_prs);
      this_00 = CTcPrsSymtab::find((CTcPrsSymtab *)
                                   CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                                   (textchar_t *)in_stack_fffffffffffffea8,0x223c64);
      if ((this_00 != (CTcSymbol *)0x0) &&
         (tVar3 = CTcSymbolBase::get_type(&this_00->super_CTcSymbolBase), tVar3 == TC_SYM_FUNC)) {
        local_28 = local_28 + local_30;
        local_30 = local_30 - 1;
        local_38 = 0;
        while (local_30 != 0) {
          local_58 = 0;
          pcVar1 = local_28;
          while( true ) {
            local_28 = pcVar1 + -1;
            local_30 = local_30 + -1;
            uVar8 = false;
            if (local_30 != 0) {
              uVar8 = pcVar1[-2] != ';';
            }
            if ((bool)uVar8 == false) break;
            local_58 = local_58 + 1;
            pcVar1 = local_28;
          }
          if (local_58 == 0) {
            write_op(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9f);
            linker_ensure_mod_obj
                      (in_stack_fffffffffffffec0,(char *)in_stack_fffffffffffffeb8,
                       CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
          }
          else if ((local_58 == 3) && (iVar4 = memcmp(local_28,"...",3), iVar4 == 0)) {
            CTcConstVal::CTcConstVal((CTcConstVal *)&stack0xffffffffffffff80);
            CTcConstVal::set_sstr
                      ((CTcConstVal *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                       (char *)in_stack_fffffffffffffea8,0x223e0b);
            CTPNConst::CTPNConst
                      ((CTPNConst *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                       in_stack_fffffffffffffea8);
            CTPNConst::gen_code(in_stack_ffffffffffffff20,
                                (int)((ulong)in_stack_ffffffffffffff18 >> 0x20),
                                (int)in_stack_ffffffffffffff18);
            linker_ensure_mod_obj
                      (in_stack_fffffffffffffec0,(char *)in_stack_fffffffffffffeb8,
                       CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
          }
          else {
            CTcParser::get_global_symtab(G_prs);
            this_01 = (CTcSymObjBase *)
                      CTcPrsSymtab::find((CTcPrsSymtab *)
                                         CONCAT44(in_stack_fffffffffffffeb4,
                                                  in_stack_fffffffffffffeb0),
                                         (textchar_t *)in_stack_fffffffffffffea8,0x223e78);
            CTcConstVal::CTcConstVal((CTcConstVal *)&stack0xffffffffffffff20);
            if ((this_01 == (CTcSymObjBase *)0x0) ||
               ((tVar3 = CTcSymbolBase::get_type((CTcSymbolBase *)this_01), tVar3 == TC_SYM_OBJ &&
                (iVar4 = CTcSymObjBase::is_extern(this_01), iVar4 != 0)))) {
              CTcMain::log_error(G_tcmain,(CTcTokFileDesc *)0x0,0,TC_SEV_ERROR,0x2b18,
                                 local_58 & 0xffffffff,local_28);
              return;
            }
            tVar3 = CTcSymbolBase::get_type((CTcSymbolBase *)this_01);
            if (tVar3 == TC_SYM_OBJ) {
              obj = CTcSymObjBase::get_obj_id(this_01);
              meta = CTcSymObjBase::get_metaclass(this_01);
              CTcConstVal::set_obj((CTcConstVal *)&stack0xffffffffffffff20,obj,meta);
              in_stack_ffffffffffffff18 = this_01;
            }
            else {
              tVar3 = CTcSymbolBase::get_type((CTcSymbolBase *)this_01);
              if (tVar3 != TC_SYM_METACLASS) {
                CTcMain::log_error(G_tcmain,(CTcTokFileDesc *)0x0,0,TC_SEV_ERROR,0x2bca,
                                   local_58 & 0xffffffff,local_28,iVar6 - (int)pcVar7,pcVar7);
                return;
              }
              tVar5 = CTcSymMetaclassBase::get_class_obj((CTcSymMetaclassBase *)this_01);
              CTcConstVal::set_obj
                        ((CTcConstVal *)&stack0xffffffffffffff20,(ulong)tVar5,TC_META_UNKNOWN);
              linker_ensure_mod_obj
                        (in_stack_fffffffffffffee0,
                         (CTcSymMetaclass *)CONCAT17(uVar8,in_stack_fffffffffffffed8));
            }
            CTPNConst::CTPNConst
                      ((CTPNConst *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                       in_stack_fffffffffffffea8);
            CTPNConst::gen_code(in_stack_ffffffffffffff20,
                                (int)((ulong)in_stack_ffffffffffffff18 >> 0x20),
                                (int)in_stack_ffffffffffffff18);
          }
          note_push((CTcGenTarg *)0x224026);
          local_38 = local_38 + 1;
        }
        if (local_38 < 0x100) {
          write_op(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9f);
          CTcDataStream::write(&G_cs->super_CTcDataStream,(int)(char)local_38,__buf,(size_t)__n);
        }
        else {
          write_op(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9f);
          CTcDataStream::write2
                    ((CTcDataStream *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                     (uint)((ulong)in_stack_fffffffffffffea8 >> 0x20));
        }
        this = G_cs;
        iVar6 = get_predef_meta_idx(G_cg,1);
        CTcDataStream::write(&this->super_CTcDataStream,(int)(char)iVar6,__buf_00,(size_t)__n);
        write_op(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9f);
        note_pop(G_cg,local_38);
        note_push((CTcGenTarg *)0x22410b);
        (*in_RSI->_vptr_CVmHashEntry[0x18])(in_RSI,0);
        (*(this_00->super_CTcSymbolBase).super_CVmHashEntryCS.super_CVmHashEntry._vptr_CVmHashEntry
          [0x18])(this_00,0);
        if (*in_RDI != 0) {
          write_op(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9f);
          CTcDataStream::write(&G_cs->super_CTcDataStream,3,__buf_01,(size_t)__n);
          CTcSymFuncBase::add_abs_fixup
                    ((CTcSymFuncBase *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
          CTcDataStream::write4
                    ((CTcDataStream *)in_stack_fffffffffffffec0,(ulong)in_stack_fffffffffffffeb8);
        }
        note_pop(G_cg,3);
        *(int *)(in_RDI + 1) = (int)in_RDI[1] + 1;
      }
    }
  }
  return;
}

Assistant:

void CTcGenTarg::multimethod_init_cb(void *ctx0, CTcSymbol *sym)
{
    mminit_ctx *ctx = (mminit_ctx *)ctx0;
    
    /* if this is a function, check to see if it's a multi-method instance */
    if (sym->get_type() == TC_SYM_FUNC)
    {
        CTcSymFunc *fsym = (CTcSymFunc *)sym;

        /* 
         *   multi-method instances have names of the form
         *   "name*type1,type2", so check the name to see if it fits the
         *   pattern 
         */
        const char *p = sym->getstr();
        size_t rem = sym->getlen();
        int is_mm = FALSE;
        for ( ; rem != 0 ; ++p, --rem)
        {
            /* 
             *   if we found a '*', it's a multimethod; otherwise, if it's
             *   anything other than a symbol character, it's not a
             *   multimethod 
             */
            if (*p == '*')
            {
                is_mm = TRUE;
                break;
            }
            else if (!is_sym(*p))
                break;
        }

        /* 
         *   If it's a multi-method symbol, build the initializer.  If it's
         *   the base function for a multi-method, build out the stub
         *   function. 
         */
        if (is_mm)
        {
            int argc;
            
            /* note the function base name - it's the part up to the '*' */
            const char *funcname = sym->getstr();
            size_t funclen = (size_t)(p - funcname);

            /* look up the base function symbol */
            CTcSymFunc *base_sym = (CTcSymFunc *)G_prs->get_global_symtab()
                                   ->find(funcname, funclen);

            /* if it's not defined as a function, ignore it */
            if (base_sym == 0 || base_sym->get_type() != TC_SYM_FUNC)
                return;

            /* 
             *   skip to the end of the string, and remove the '*' from the
             *   length count 
             */
            p += rem;
            --rem;

            /* 
             *   Run through the decorated name and look up each mentioned
             *   class.  We need to push the parameters onto the stack in
             *   reverse order to match the VM calling conventions.  
             */
            for (argc = 0 ; rem != 0 ; ++argc)
            {
                /* remember where the current name starts */
                size_t plen;

                /* skip the terminator for this item */
                --p, --rem;

                /* scan backwards to the previous delimiter */
                for (plen = 0 ; rem != 0 && *(p-1) != ';' ;
                     --p, --rem, ++plen) ;

                /* look up this name */
                if (plen == 0)
                {
                    /* 
                     *   empty name - this slot accepts any type; represent
                     *   this in the run-time formal list with 'nil' 
                     */
                    G_cg->write_op(OPC_PUSHNIL);

                    /* 
                     *   An untyped slot is implicitly an Object slot, so we
                     *   need to make sure that Object can participate in the
                     *   binding property system by ensuring that it has a
                     *   modifier object. 
                     */
                    G_cg->linker_ensure_mod_obj("Object", 6);
                }
                else if (plen == 3 && memcmp(p, "...", 3) == 0)
                {
                    /* 
                     *   varargs indicator - represent this in the list with
                     *   the literal string '...' 
                     */
                    CTcConstVal val;
                    val.set_sstr("...", 3);
                    CTPNConst cval(&val);
                    cval.gen_code(FALSE, FALSE);

                    /* 
                     *   a varargs slot is implicitly an Object slot, so make
                     *   sure Object has a modifier object
                     */
                    G_cg->linker_ensure_mod_obj("Object", 6);
                }
                else
                {
                    /* class name - look it up */
                    CTcSymbol *cl = G_prs->get_global_symtab()->find(p, plen);
                    CTcConstVal val;

                    /* 
                     *   if it's missing, unresolved, or not an object, flag
                     *   an error 
                     */
                    if (cl == 0
                        || (cl->get_type() == TC_SYM_OBJ
                            && ((CTcSymObj *)cl)->is_extern()))
                    {
                        G_tcmain->log_error(
                            0, 0, TC_SEV_ERROR, TCERR_UNDEF_SYM,
                            (int)plen, p);
                        return;
                    }
                    else if (cl->get_type() == TC_SYM_OBJ)
                    {
                        /* get the object information */
                        CTcSymObj *co = (CTcSymObj *)cl;
                        val.set_obj(co->get_obj_id(), co->get_metaclass());
                    }
                    else if (cl->get_type() == TC_SYM_METACLASS)
                    {
                        /* get the metaclass information */
                        CTcSymMetaclass *cm = (CTcSymMetaclass *)cl;
                        val.set_obj(cm->get_class_obj(), TC_META_UNKNOWN);

                        /*
                         *   If this metaclass doesn't have a modifier
                         *   object, create one for it.  This is needed
                         *   because the run-time library's multi-method
                         *   implementation stores the method binding
                         *   information in properties of the parameter
                         *   objects.  Since we're using this metaclass as a
                         *   parameter type, we'll need to write at least one
                         *   property to it.  We can only write properties to
                         *   intrinsic class objects when they're equipped
                         *   with modifier objects.
                         *   
                         *   The presence of a modifier object has no effect
                         *   at all on performance for ordinary method call
                         *   operations on the intrinsic class, and the
                         *   modifier itself is just a bare object, so the
                         *   cost of creating this extra object is trivial.  
                         */
                        G_cg->linker_ensure_mod_obj(cm);
                    }
                    else
                    {
                        /* it's not a valid object type */
                        G_tcmain->log_error(
                            0, 0, TC_SEV_ERROR, TCERR_MMPARAM_NOT_OBJECT,
                            (int)plen, p, (int)funclen, funcname);
                        return;
                    }

                    /* 
                     *   represent the object or class in the parameter list
                     *   with the object reference
                     */
                    CTPNConst cval(&val);
                    cval.gen_code(FALSE, FALSE);
                }

                /* note the value we pushed */
                G_cg->note_push();
            }

            /* build and push the list from the parameters */
            if (argc <= 255)
            {
                G_cg->write_op(OPC_NEW1);
                G_cs->write((char)argc);
            }
            else
            {
                G_cg->write_op(OPC_NEW2);
                G_cs->write2(argc);
            }
            G_cs->write((char)G_cg->get_predef_meta_idx(TCT3_METAID_LIST));
            G_cg->write_op(OPC_GETR0);
            G_cg->note_pop(argc);
            G_cg->note_push();

            /* push the function pointer argument */
            fsym->gen_code(FALSE);

            /* push the base function pointer argument */
            base_sym->gen_code(FALSE);

            /* 
             *   call _multiMethodRegister, if it's available (if it's not,
             *   our caller will flag this as an error, so just skip the code
             *   generation here) 
             */
            if (ctx->mmr != 0)
            {
                G_cg->write_op(OPC_CALL);
                G_cs->write(3);                           /* argument count */
                ctx->mmr->add_abs_fixup(G_cs);    /* function address fixup */
                G_cs->write4(0);                       /* fixup placeholder */
            }

            /* the 3 arguments will be gone on return */
            G_cg->note_pop(3);

            /* count the registration */
            ctx->cnt += 1;
        }
    }
}